

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool *connection_close)

{
  Headers *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  Headers *headers;
  char *pcVar7;
  key_type local_a0;
  Headers *local_80;
  bool *local_78;
  long *local_70 [2];
  long local_60 [2];
  _Any_data local_50;
  code *local_40;
  
  write_request(this,strm,req);
  bVar4 = read_response_line(this,strm,res);
  if (!bVar4) {
    return false;
  }
  this_00 = &res->headers;
  bVar4 = detail::read_headers((detail *)strm,(Stream *)this_00,headers);
  if (!bVar4) {
    return false;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_78 = connection_close;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Connection","");
  local_80 = this_00;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pbVar3 = local_78;
  p_Var1 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    pcVar7 = "";
  }
  else {
    pcVar7 = *(char **)(cVar6._M_node + 2);
  }
  std::__cxx11::string::string((string *)local_70,pcVar7,(allocator *)&local_a0);
  iVar5 = std::__cxx11::string::compare((char *)local_70);
  if (iVar5 == 0) {
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)res);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (iVar5 != 0) goto LAB_0014cb50;
  }
  *pbVar3 = true;
LAB_0014cb50:
  iVar5 = std::__cxx11::string::compare((char *)&req->method);
  if (iVar5 == 0) {
    return true;
  }
  std::function<bool_(unsigned_long,_unsigned_long)>::function
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_50,&req->progress);
  bVar4 = detail::read_content<httplib::Response>(strm,res,(Progress *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (bVar4) {
    paVar2 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Content-Encoding","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_80->_M_t,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)(cVar6._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_a0,pcVar7,(allocator *)local_70);
    iVar5 = std::__cxx11::string::compare((char *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool Client::process_request(Stream& strm, Request& req, Response& res, bool& connection_close)
{
    // Send request
    write_request(strm, req);

    // Receive response and headers
    if (!read_response_line(strm, res) || !detail::read_headers(strm, res.headers)) {
        return false;
    }

    if (res.get_header_value("Connection") == "close" || res.version == "HTTP/1.0") {
        connection_close = true;
    }

    // Body
    if (req.method != "HEAD") {
        if (!detail::read_content(strm, res, req.progress)) {
            return false;
        }

        if (res.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(res.body);
#else
            return false;
#endif
        }
    }

    return true;
}